

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

void __thiscall
PruneReplayer::notify_application_info_link
          (PruneReplayer *this,Hash link_hash,Hash app_hash,ResourceTag tag,Hash hash)

{
  bool bVar1;
  __hashtable *__h_1;
  __node_gen_type __node_gen;
  Hash local_30;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_28;
  Hash local_20;
  
  if ((this->skip_application_info_links == false) &&
     (local_30 = link_hash, local_20 = hash,
     bVar1 = filter_timestamp(this,RESOURCE_APPLICATION_BLOB_LINK,link_hash,(uint64_t *)0x0), bVar1)
     ) {
    if ((this->should_filter_application_hash == true) &&
       (this->filter_application_hash == app_hash)) {
      local_28 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)(this->filtered_blob_hashes + tag);
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                (local_28,&local_20,&local_28);
    }
    else if (this->should_filter_application_hash != false) {
      return;
    }
    local_28 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)(this->filtered_blob_hashes + 8);
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              (local_28,&local_30,&local_28);
  }
  return;
}

Assistant:

void notify_application_info_link(Hash link_hash, Hash app_hash, ResourceTag tag, Hash hash) override
	{
		if (skip_application_info_links)
			return;

		if (!filter_timestamp(RESOURCE_APPLICATION_BLOB_LINK, link_hash, nullptr))
			return;

		if (should_filter_application_hash && app_hash == filter_application_hash)
		{
			filtered_blob_hashes[tag].insert(hash);
			filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK].insert(link_hash);
		}
		else if (!should_filter_application_hash)
			filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK].insert(link_hash);
	}